

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Extensive
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  VmaBlockMetadata *pVVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  VmaAllocationCreateFlags VVar6;
  size_t sVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool otherPresent;
  bool bufferPresent;
  bool texturePresent;
  MoveAllocationData moveData;
  bool local_83;
  bool local_82;
  bool local_81;
  byte *local_80;
  ulong local_78;
  size_t local_70;
  size_t local_68;
  MoveAllocationData local_60 [2];
  
code_r0x001c0cbe:
  if (vector->m_BufferImageGranularity == 1) {
    bVar2 = ComputeDefragmentation_Full(this,vector);
    return bVar2;
  }
  pbVar9 = (byte *)((long)this->m_AlgorithmState + index * 0x10);
  bVar4 = false;
  bVar12 = false;
  local_81 = false;
  local_82 = false;
  local_83 = false;
  bVar2 = false;
  switch(*(undefined1 *)((long)this->m_AlgorithmState + index * 0x10)) {
  case 0:
  case 1:
  case 2:
    sVar7 = *(size_t *)(pbVar9 + 8);
    if (sVar7 == 0xffffffffffffffff) {
      sVar7 = (vector->m_Blocks).m_Count;
    }
    else if (sVar7 == 0) {
      *pbVar9 = 6;
      bVar2 = ComputeDefragmentation_Fast(this,vector);
      return bVar2;
    }
    local_78 = sVar7 - 1;
    pVVar1 = (vector->m_Blocks).m_pArray[sVar7 - 1]->m_pMetadata;
    local_70 = (this->m_Moves).m_Count;
    local_80 = pbVar9;
    local_68 = index;
    iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[0xb])(pVVar1);
    lVar8 = CONCAT44(extraout_var,iVar5);
    pbVar9 = local_80;
    goto joined_r0x001c0da3;
  case 3:
switchD_001c0d34_caseD_3:
    local_82 = false;
    local_83 = false;
    bVar12 = MoveDataToFreeBlocks
                       (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)(pbVar9 + 8),&local_81,
                        &local_82,&local_83);
    bVar2 = bVar4;
    if (!bVar12) goto switchD_001c0d34_caseD_6;
    if (local_82 != true) {
      if (local_83 != true) goto LAB_001c1072;
      *pbVar9 = 5;
      goto switchD_001c0d34_caseD_5;
    }
    break;
  case 4:
    bVar12 = MoveDataToFreeBlocks
                       (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,*(size_t *)(pbVar9 + 8),
                        &local_81,&local_82,&local_83);
    bVar2 = bVar4;
    if (!bVar12) goto switchD_001c0d34_caseD_6;
    if (local_81 != true) {
      if ((local_82 != false) || (local_83 == true)) {
        *pbVar9 = 3;
        goto switchD_001c0d34_caseD_3;
      }
      goto LAB_001c1072;
    }
    *pbVar9 = 1;
    goto code_r0x001c0cbe;
  case 5:
switchD_001c0d34_caseD_5:
    local_83 = false;
    bVar12 = MoveDataToFreeBlocks
                       (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)(pbVar9 + 8),&local_81,
                        &local_82,&local_83);
    bVar2 = false;
    if (!bVar12) goto switchD_001c0d34_caseD_6;
    if (local_83 != true) {
LAB_001c1072:
      *pbVar9 = 6;
      bVar2 = bVar4;
      goto switchD_001c0d34_caseD_6;
    }
    break;
  default:
    goto switchD_001c0d34_caseD_6;
  case 7:
    goto switchD_001c0d34_caseD_7;
  }
  *pbVar9 = 0;
  goto code_r0x001c0cbe;
joined_r0x001c0da3:
  local_80 = pbVar9;
  if (lVar8 == 0) goto LAB_001c0ec2;
  iVar11 = 0;
  local_60[0].move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
  local_60[0].move.srcAllocation = (VmaAllocation)0x0;
  local_60[0].move.dstTmpAllocation = (VmaAllocation)0x0;
  iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[10])(pVVar1,lVar8);
  local_60[0].move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar5);
  local_60[0].size = (local_60[0].move.srcAllocation)->m_Size;
  local_60[0].alignment = (local_60[0].move.srcAllocation)->m_Alignment;
  local_60[0].type = (VmaSuballocationType)(local_60[0].move.srcAllocation)->m_SuballocationType;
  VVar6 = ((local_60[0].move.srcAllocation)->m_Flags & 1) * 4;
  local_60[0].flags = VVar6 + 0xc00;
  if (((local_60[0].move.srcAllocation)->m_Flags & 2) == 0) {
    local_60[0].flags = VVar6;
  }
  if (this->m_MaxPassBytes < local_60[0].size + (this->m_PassStats).bytesMoved) {
    bVar3 = this->m_IgnoredAllocs + 1;
    this->m_IgnoredAllocs = bVar3;
    iVar11 = 2 - (uint)(bVar3 < 0x10);
  }
  if (iVar11 == 1) {
    iVar5 = 5;
  }
  else if (iVar11 == 2) {
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    bVar2 = AllocInOtherBlock(this,0,local_78,local_60,vector);
    if (((bVar2) && (iVar5 = 1, local_70 != (this->m_Moves).m_Count)) &&
       (iVar11 = (*pVVar1->_vptr_VmaBlockMetadata[0xc])(pVVar1,lVar8),
       CONCAT44(extraout_var_01,iVar11) == 0)) {
      *(ulong *)((long)this->m_AlgorithmState + local_68 * 8) = local_78;
    }
  }
  if ((iVar5 != 5) && (iVar5 != 0)) {
    bVar12 = true;
    bVar4 = false;
    pbVar9 = local_80;
    goto LAB_001c0fb1;
  }
  iVar5 = (*pVVar1->_vptr_VmaBlockMetadata[0xc])(pVVar1,lVar8);
  lVar8 = CONCAT44(extraout_var_02,iVar5);
  pbVar9 = local_80;
  goto joined_r0x001c0da3;
LAB_001c0ec2:
  if (local_70 == (this->m_Moves).m_Count) {
    if (1 < local_78) {
      lVar8 = sVar7 - 2;
      do {
        bVar2 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar8]);
        if (bVar2) {
          bVar12 = true;
          goto LAB_001c0fa3;
        }
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    bVar4 = true;
    bVar12 = true;
    if (local_70 != (this->m_Moves).m_Count) goto LAB_001c0fb1;
    bVar12 = ComputeDefragmentation_Fast(this,vector);
  }
  else {
    bVar3 = 3;
    if (*pbVar9 != 0) {
      bVar3 = *pbVar9 == 2 | 4;
    }
    *pbVar9 = bVar3;
    *(ulong *)(pbVar9 + 8) = local_78;
    bVar12 = ComputeDefragmentation_Extensive(this,vector,local_68);
  }
LAB_001c0fa3:
  bVar4 = false;
LAB_001c0fb1:
  bVar2 = bVar12;
  if (bVar4) {
switchD_001c0d34_caseD_6:
    if (*pbVar9 == 6) {
      sVar7 = (this->m_Moves).m_Count;
      bVar12 = (vector->m_Blocks).m_Count != 0;
      if (bVar12) {
        bVar4 = ReallocWithinBlock(this,vector,*(vector->m_Blocks).m_pArray);
        if (bVar4) {
          bVar2 = true;
        }
        else {
          uVar10 = 1;
          local_80 = pbVar9;
          do {
            bVar12 = uVar10 < (vector->m_Blocks).m_Count;
            pbVar9 = local_80;
            if (!bVar12) goto LAB_001c10eb;
            bVar4 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar10]);
            uVar10 = uVar10 + 1;
          } while (!bVar4);
          bVar2 = true;
          pbVar9 = local_80;
        }
      }
LAB_001c10eb:
      if (bVar12) {
        return bVar2;
      }
      if (sVar7 == (this->m_Moves).m_Count) {
        *pbVar9 = 7;
      }
    }
    bVar12 = false;
  }
switchD_001c0d34_caseD_7:
  return bVar12;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Extensive(VmaBlockVector& vector, size_t index)
{
    // First free single block, then populate it to the brim, then free another block, and so on

    // Fallback to previous algorithm since without granularity conflicts it can achieve max packing
    if (vector.m_BufferImageGranularity == 1)
        return ComputeDefragmentation_Full(vector);

    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateExtensive& vectorState = reinterpret_cast<StateExtensive*>(m_AlgorithmState)[index];

    bool texturePresent = false, bufferPresent = false, otherPresent = false;
    switch (vectorState.operation)
    {
    case StateExtensive::Operation::Done: // Vector defragmented
        return false;
    case StateExtensive::Operation::FindFreeBlockBuffer:
    case StateExtensive::Operation::FindFreeBlockTexture:
    case StateExtensive::Operation::FindFreeBlockAll:
    {
        // No more blocks to free, just perform fast realloc and move to cleanup
        if (vectorState.firstFreeBlock == 0)
        {
            vectorState.operation = StateExtensive::Operation::Cleanup;
            return ComputeDefragmentation_Fast(vector);
        }

        // No free blocks, have to clear last one
        size_t last = (vectorState.firstFreeBlock == SIZE_MAX ? vector.GetBlockCount() : vectorState.firstFreeBlock) - 1;
        VmaBlockMetadata* freeMetadata = vector.GetBlock(last)->m_pMetadata;

        const size_t prevMoveCount = m_Moves.size();
        for (VmaAllocHandle handle = freeMetadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = freeMetadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, freeMetadata);
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            if (AllocInOtherBlock(0, last, moveData, vector))
            {
                // Full clear performed already
                if (prevMoveCount != m_Moves.size() && freeMetadata->GetNextAllocation(handle) == VK_NULL_HANDLE)
                    reinterpret_cast<size_t*>(m_AlgorithmState)[index] = last;
                return true;
            }
        }

        if (prevMoveCount == m_Moves.size())
        {
            // Cannot perform full clear, have to move data in other blocks around
            if (last != 0)
            {
                for (size_t i = last - 1; i; --i)
                {
                    if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                        return true;
                }
            }

            if (prevMoveCount == m_Moves.size())
            {
                // No possible reallocs within blocks, try to move them around fast
                return ComputeDefragmentation_Fast(vector);
            }
        }
        else
        {
            switch (vectorState.operation)
            {
            case StateExtensive::Operation::FindFreeBlockBuffer:
                vectorState.operation = StateExtensive::Operation::MoveBuffers;
                break;
            default:
                VMA_ASSERT(0);
            case StateExtensive::Operation::FindFreeBlockTexture:
                vectorState.operation = StateExtensive::Operation::MoveTextures;
                break;
            case StateExtensive::Operation::FindFreeBlockAll:
                vectorState.operation = StateExtensive::Operation::MoveAll;
                break;
            }
            vectorState.firstFreeBlock = last;
            // Nothing done, block found without reallocations, can perform another reallocs in same pass
            return ComputeDefragmentation_Extensive(vector, index);
        }
        break;
    }
    case StateExtensive::Operation::MoveTextures:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (texturePresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockTexture;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!bufferPresent && !otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more textures to move, check buffers
            vectorState.operation = StateExtensive::Operation::MoveBuffers;
            bufferPresent = false;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveBuffers:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_BUFFER, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (bufferPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }

            if (!otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::Cleanup;
                break;
            }

            // No more buffers to move, check all others
            vectorState.operation = StateExtensive::Operation::MoveAll;
            otherPresent = false;
        }
        else
            break;
    }
    case StateExtensive::Operation::MoveAll:
    {
        if (MoveDataToFreeBlocks(VMA_SUBALLOCATION_TYPE_FREE, vector,
            vectorState.firstFreeBlock, texturePresent, bufferPresent, otherPresent))
        {
            if (otherPresent)
            {
                vectorState.operation = StateExtensive::Operation::FindFreeBlockBuffer;
                return ComputeDefragmentation_Extensive(vector, index);
            }
            // Everything moved
            vectorState.operation = StateExtensive::Operation::Cleanup;
        }
        break;
    }
    case StateExtensive::Operation::Cleanup:
        // Cleanup is handled below so that other operations may reuse the cleanup code. This case is here to prevent the unhandled enum value warning (C4062).
        break;
    }

    if (vectorState.operation == StateExtensive::Operation::Cleanup)
    {
        // All other work done, pack data in blocks even tighter if possible
        const size_t prevMoveCount = m_Moves.size();
        for (size_t i = 0; i < vector.GetBlockCount(); ++i)
        {
            if (ReallocWithinBlock(vector, vector.GetBlock(i)))
                return true;
        }

        if (prevMoveCount == m_Moves.size())
            vectorState.operation = StateExtensive::Operation::Done;
    }
    return false;
}